

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O3

string * __thiscall
tvm::runtime::ModuleNode::GetSource(string *__return_storage_ptr__,ModuleNode *this,string *format)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  undefined1 auStack_1a8 [8];
  LogMessageFatal local_1a0;
  char *__s;
  
  dmlc::LogMessageFatal::LogMessageFatal
            (&local_1a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module.cc"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"Module[",7);
  iVar1 = (*this->_vptr_ModuleNode[2])(this);
  __s = (char *)CONCAT44(extraout_var,iVar1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_1a8 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) + 8);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"] does not support GetSource",0x1c);
  dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleNode::GetSource(const std::string &format) {
  LOG(FATAL) << "Module[" << type_key() << "] does not support GetSource";
  return "";
}